

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void duckdb::Parser::ParseUpdateList
               (string *update_list,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *update_columns,
               vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               *expressions,ParserOptions options)

{
  ParserOptions options_p;
  size_type sVar1;
  pointer pSVar2;
  undefined8 uVar3;
  string *in_stack_00000008;
  Parser *in_stack_00000010;
  UpdateStatement *update;
  Parser parser;
  string mock_query;
  string *in_stack_000003d8;
  Parser *in_stack_000003e0;
  Parser *this;
  undefined8 in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  vector<duckdb::ParserExtension,_true> *in_stack_fffffffffffffef0;
  SQLStatement *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  allocator *paVar4;
  allocator aStack_b9;
  string asStack_b8 [80];
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  avStack_68 [2];
  string asStack_38 [56];
  
  ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
            (in_stack_ffffffffffffff18,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff10);
  options_p.max_expression_depth = in_stack_fffffffffffffee8;
  options_p.preserve_identifier_case = (bool)(char)in_stack_fffffffffffffee0;
  options_p.integer_division = (bool)(char)((ulong)in_stack_fffffffffffffee0 >> 8);
  options_p._2_6_ = (int6)((ulong)in_stack_fffffffffffffee0 >> 0x10);
  options_p.extensions = in_stack_fffffffffffffef0;
  Parser(in_stack_00000010,options_p);
  ParseQuery(in_stack_000003e0,in_stack_000003d8);
  sVar1 = ::std::
          vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
          ::size(avStack_68);
  this = in_stack_00000010;
  if (sVar1 == 1) {
    vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
    ::operator[](&in_stack_00000010->statements,(size_type)in_stack_00000008);
    pSVar2 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
             operator->((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                         *)in_stack_00000010);
    this = in_stack_00000010;
    if (pSVar2->type == UPDATE_STATEMENT) {
      vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
      ::operator[](&in_stack_00000010->statements,(size_type)in_stack_00000008);
      unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::operator->
                ((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                  *)in_stack_00000010);
      SQLStatement::Cast<duckdb::UpdateStatement>(in_stack_ffffffffffffff10);
      unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>,_true>::
      operator->((unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>,_true>
                  *)in_stack_00000010);
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   *)in_stack_00000010,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   *)in_stack_00000008);
      unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>,_true>::
      operator->((unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>,_true>
                  *)in_stack_00000010);
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
      ::operator=((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                   *)in_stack_00000010,
                  (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                   *)in_stack_00000008);
      ~Parser((Parser *)0x2a21fbb);
      ::std::__cxx11::string::~string(asStack_38);
      return;
    }
  }
  uVar3 = __cxa_allocate_exception(0x10);
  paVar4 = &aStack_b9;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(asStack_b8,"Expected a single UPDATE statement",paVar4);
  ParserException::ParserException((ParserException *)this,in_stack_00000008);
  __cxa_throw(uVar3,&ParserException::typeinfo,ParserException::~ParserException);
}

Assistant:

void Parser::ParseUpdateList(const string &update_list, vector<string> &update_columns,
                             vector<unique_ptr<ParsedExpression>> &expressions, ParserOptions options) {
	// construct a mock query
	string mock_query = "UPDATE tbl SET " + update_list;
	// parse the query
	Parser parser(options);
	parser.ParseQuery(mock_query);
	// check the statements
	if (parser.statements.size() != 1 || parser.statements[0]->type != StatementType::UPDATE_STATEMENT) {
		throw ParserException("Expected a single UPDATE statement");
	}
	auto &update = parser.statements[0]->Cast<UpdateStatement>();
	update_columns = std::move(update.set_info->columns);
	expressions = std::move(update.set_info->expressions);
}